

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O3

void __thiscall QtMWidgets::ToolBar::setAlignment(ToolBar *this,Alignment align)

{
  ToolBarLayout *pTVar1;
  
  if (((align.i & 0xe7) != 0) && (pTVar1 = ((this->d).d)->layout, (pTVar1->align).i != align.i)) {
    (pTVar1->align).i = align.i & 0xe7;
    QLayout::update();
    return;
  }
  return;
}

Assistant:

void
ToolBarLayout::setAlignment( Qt::Alignment a )
{
	if( a & ( Qt::AlignLeft | Qt::AlignRight | Qt::AlignCenter
				| Qt::AlignTop | Qt::AlignBottom ) )
	{
		if( align != a )
		{
			align = a & ( Qt::AlignLeft | Qt::AlignRight | Qt::AlignCenter
				| Qt::AlignTop | Qt::AlignBottom );

			update();
		}
	}
}